

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

void __thiscall
testing::internal::
VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::internal::GeMatcher<char>,testing::internal::LeMatcher<char>>
::CreateVariadicMatcher<char_const&,0ul>
          (VariadicMatcher<testing::internal::AllOfMatcherImpl,testing::internal::GeMatcher<char>,testing::internal::LeMatcher<char>>
           *this,vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
                 *values)

{
  testing *this_00;
  GeMatcher<char> *polymorphic_matcher_or_value;
  Matcher<const_char_&> local_38;
  vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_> *local_20
  ;
  vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
  *values_local;
  VariadicMatcher<testing::internal::AllOfMatcherImpl,_testing::internal::GeMatcher<char>,_testing::internal::LeMatcher<char>_>
  *this_local;
  
  local_20 = values;
  values_local = (vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>
                  *)this;
  this_00 = (testing *)
            std::get<0ul,testing::internal::GeMatcher<char>,testing::internal::LeMatcher<char>>
                      ((tuple<testing::internal::GeMatcher<char>,_testing::internal::LeMatcher<char>_>
                        *)this);
  SafeMatcherCast<char_const&,testing::internal::GeMatcher<char>>
            (&local_38,this_00,polymorphic_matcher_or_value);
  std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>::
  push_back(values,&local_38);
  Matcher<const_char_&>::~Matcher(&local_38);
  CreateVariadicMatcher<char_const&,1ul>(this,local_20);
  return;
}

Assistant:

void CreateVariadicMatcher(std::vector<Matcher<T> >* values,
                             std::integral_constant<size_t, I>) const {
    values->push_back(SafeMatcherCast<T>(std::get<I>(matchers_)));
    CreateVariadicMatcher<T>(values, std::integral_constant<size_t, I + 1>());
  }